

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_remove_without_global(REF_NODE ref_node,REF_INT node)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  long lVar5;
  REF_INT location;
  
  location = (REF_INT)((ulong)in_RAX >> 0x20);
  uVar1 = 3;
  if ((-1 < node) && (node < ref_node->max)) {
    if (-1 < ref_node->global[(uint)node]) {
      uVar1 = ref_sort_search_glob
                        (ref_node->n,ref_node->sorted_global,ref_node->global[(uint)node],&location)
      ;
      if (uVar1 == 0) {
        uVar3 = (ulong)ref_node->n;
        lVar4 = (long)location;
        for (lVar5 = lVar4; lVar5 < (long)(uVar3 - 1); lVar5 = lVar5 + 1) {
          ref_node->sorted_global[lVar5] = ref_node->sorted_global[lVar5 + 1];
        }
        for (; iVar2 = (int)uVar3 + -1, lVar4 < iVar2; lVar4 = lVar4 + 1) {
          ref_node->sorted_local[lVar4] = ref_node->sorted_local[lVar4 + 1];
          uVar3 = (ulong)(uint)ref_node->n;
        }
        ref_node->global[(uint)node] = (long)ref_node->blank;
        ref_node->blank = -2 - node;
        ref_node->n = iVar2;
        uVar1 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x1d4,"ref_node_remove_without_global",(ulong)uVar1,"find global in sort list");
      }
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_remove_without_global(REF_NODE ref_node,
                                                  REF_INT node) {
  REF_INT location, sorted_node;
  if (!ref_node_valid(ref_node, node)) return REF_INVALID;

  RSS(ref_sort_search_glob(ref_node_n(ref_node), ref_node->sorted_global,
                           ref_node->global[node], &location),
      "find global in sort list");

  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_global[sorted_node] =
        ref_node->sorted_global[sorted_node + 1];
  for (sorted_node = location; sorted_node < ref_node_n(ref_node) - 1;
       sorted_node++)
    ref_node->sorted_local[sorted_node] =
        ref_node->sorted_local[sorted_node + 1];

  ref_node->global[node] = ref_node->blank;
  ref_node->blank = index2next(node);

  (ref_node->n)--;

  return REF_SUCCESS;
}